

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O2

void mwrite(memfile *mf,void *buf,uint num)

{
  mdiff_cmd mVar1;
  char *__ptr;
  int iVar2;
  size_t __size;
  mdiff_cmd mVar3;
  bool bVar4;
  
  iVar2 = mf->pos;
  __size = (size_t)mf->len;
  bVar4 = true;
  while ((uint)__size < iVar2 + num) {
    __size = __size + 0x1000;
    mf->len = (int)__size;
    bVar4 = false;
  }
  __ptr = mf->buf;
  if (!bVar4) {
    __ptr = (char *)realloc(__ptr,__size);
    mf->buf = __ptr;
    iVar2 = mf->pos;
  }
  memcpy(__ptr + iVar2,buf,(ulong)num);
  if (mf->relativeto == (memfile *)0x0) {
    mf->pos = mf->pos + num;
  }
  else {
    while (bVar4 = num != 0, num = num - 1, bVar4) {
      if (mf->relativepos < mf->relativeto->pos) {
        mVar1 = mf->curcmd;
        if (mf->buf[mf->pos] != mf->relativeto->buf[mf->relativepos]) goto LAB_001bb188;
        mVar3 = MDIFF_COPY;
        if (mVar1 == MDIFF_COPY) {
          iVar2 = mf->curcount;
          goto joined_r0x001bb19c;
        }
LAB_001bb19e:
        mdiffflush(mf);
        iVar2 = 0;
      }
      else {
        mVar1 = mf->curcmd;
LAB_001bb188:
        mVar3 = MDIFF_EDIT;
        if (mVar1 != MDIFF_EDIT) goto LAB_001bb19e;
        iVar2 = mf->curcount;
joined_r0x001bb19c:
        if (0x3ffe < iVar2) goto LAB_001bb19e;
      }
      mf->curcmd = mVar3;
      mf->curcount = iVar2 + 1;
      mf->pos = mf->pos + 1;
      mf->relativepos = mf->relativepos + 1;
    }
  }
  return;
}

Assistant:

void mwrite(struct memfile *mf, const void *buf, unsigned int num)
{
	boolean do_realloc = FALSE;
	while (mf->len < mf->pos + num) {
	    mf->len += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->buf = realloc(mf->buf, mf->len);
	memcpy(&mf->buf[mf->pos], buf, num);

	if (!mf->relativeto) {
	    mf->pos += num;
	} else {
	    /* calculate and record the diff as well */
	    while (num--) {
		if (mf->relativepos < mf->relativeto->pos &&
		    mf->buf[mf->pos] == mf->relativeto->buf[mf->relativepos]) {
		    if (mf->curcmd != MDIFF_COPY || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_COPY;
		    mf->curcount++;
		} else {
		    /*
		     * Note that mdiffflush is responsible for writing the
		     * actual data that was edited, once we have a complete
		     * run of it. So there's no need to record the data
		     * anywhere but in buf.
		     */
		    if (mf->curcmd != MDIFF_EDIT || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_EDIT;
		    mf->curcount++;
		}
		mf->pos++;
		mf->relativepos++;
	    }
	}
}